

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigOper.c
# Opt level: O2

Aig_Obj_t * Aig_Oper(Aig_Man_t *p,Aig_Obj_t *p0,Aig_Obj_t *p1,Aig_Type_t Type)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  
  if (Type != AIG_OBJ_EXOR) {
    if (Type != AIG_OBJ_AND) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigOper.c"
                    ,0x59,"Aig_Obj_t *Aig_Oper(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *, Aig_Type_t)");
    }
    pAVar1 = Aig_And(p,p0,p1);
    return pAVar1;
  }
  if (p0 == p1) {
    pAVar1 = (Aig_Obj_t *)((ulong)p->pConst1 ^ 1);
  }
  else if ((Aig_Obj_t *)((ulong)p1 ^ 1) == p0) {
    pAVar1 = p->pConst1;
  }
  else {
    pAVar2 = (Aig_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
    pAVar1 = p->pConst1;
    if (pAVar1 == pAVar2) {
      pAVar1 = (Aig_Obj_t *)(ulong)(pAVar2 == p0);
    }
    else {
      if (pAVar1 == (Aig_Obj_t *)((ulong)p1 & 0xfffffffffffffffe)) {
        return (Aig_Obj_t *)((ulong)(pAVar1 == p1) ^ (ulong)p0);
      }
      if (p->fCatchExor == 0) {
        pAVar1 = Aig_And(p,p0,(Aig_Obj_t *)((ulong)p1 ^ 1));
        pAVar2 = Aig_And(p,(Aig_Obj_t *)((ulong)p0 ^ 1),p1);
        pAVar1 = Aig_Or(p,pAVar1,pAVar2);
        return pAVar1;
      }
      pAVar1 = Aig_ObjCreateGhost(p,pAVar2,(Aig_Obj_t *)((ulong)p1 & 0xfffffffffffffffe),
                                  AIG_OBJ_EXOR);
      pAVar2 = Aig_TableLookup(p,pAVar1);
      p1 = (Aig_Obj_t *)(ulong)(((uint)p1 ^ (uint)p0) & 1);
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        return (Aig_Obj_t *)((ulong)p1 ^ (ulong)pAVar2);
      }
      pAVar1 = Aig_ObjCreate(p,pAVar1);
    }
    pAVar1 = (Aig_Obj_t *)((ulong)pAVar1 ^ (ulong)p1);
  }
  return pAVar1;
}

Assistant:

Aig_Obj_t * Aig_Oper( Aig_Man_t * p, Aig_Obj_t * p0, Aig_Obj_t * p1, Aig_Type_t Type )
{
    if ( Type == AIG_OBJ_AND )
        return Aig_And( p, p0, p1 );
    if ( Type == AIG_OBJ_EXOR )
        return Aig_Exor( p, p0, p1 );
    assert( 0 );
    return NULL;
}